

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseExprList(WastParser *this,ExprList *exprs)

{
  Expr *pEVar1;
  Expr *pEVar2;
  bool bVar3;
  Result RVar4;
  Enum EVar5;
  int __flags;
  ExprList local_58;
  ExprList *local_38;
  undefined8 uStack_30;
  
  local_58.first_ = (Expr *)0x0;
  local_58.last_ = (Expr *)0x0;
  local_58.size_ = 0;
  do {
    while( true ) {
      bVar3 = PeekMatchExpr(this);
      if (!bVar3) {
        EVar5 = Ok;
        pEVar2 = local_58.first_;
        goto joined_r0x00f6028f;
      }
      RVar4 = ParseExpr(this,&local_58);
      if (RVar4.enum_ != Ok) break;
      uStack_30 = 0;
      __flags = (int)&local_58;
      local_38 = &local_58;
      intrusive_list<wabt::Expr>::splice
                (exprs,(int)exprs,(__off64_t *)0x0,__flags,(__off64_t *)&local_58,
                 (size_t)local_58.first_,__flags);
    }
    RVar4 = Synchronize(this,anon_unknown_1::IsExpr);
  } while (RVar4.enum_ != Error);
  EVar5 = Error;
  pEVar2 = local_58.first_;
joined_r0x00f6028f:
  while (pEVar2 != (Expr *)0x0) {
    pEVar1 = (pEVar2->super_intrusive_list_base<wabt::Expr>).next_;
    (*pEVar2->_vptr_Expr[1])();
    pEVar2 = pEVar1;
  }
  return (Result)EVar5;
}

Assistant:

Result WastParser::ParseExprList(ExprList* exprs) {
  WABT_TRACE(ParseExprList);
  ExprList new_exprs;
  while (PeekMatchExpr()) {
    if (Succeeded(ParseExpr(&new_exprs))) {
      exprs->splice(exprs->end(), new_exprs);
    } else {
      CHECK_RESULT(Synchronize(IsExpr));
    }
  }
  return Result::Ok;
}